

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O2

void __thiscall
flatbuffers::BinaryAnnotator::BuildTable
          (BinaryAnnotator *this,uint64_t table_offset,BinarySectionType type,Object *table)

{
  map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  *__x;
  uint *puVar1;
  uint8_t value;
  Field *this_00;
  ulong uVar2;
  uint64_t uVar3;
  pointer pEVar4;
  pointer pEVar5;
  bool bVar6;
  uint16_t uVar7;
  BaseType BVar8;
  BinaryRegionType BVar9;
  Optional<int> OVar10;
  String *pSVar11;
  VTable *pVVar12;
  _Rb_tree_header *p_Var13;
  _Base_ptr p_Var14;
  Type *pTVar15;
  ostream *poVar16;
  Optional<unsigned_int> OVar17;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *this_01;
  return_type this_02;
  const_iterator cVar18;
  ulong uVar19;
  ulong uVar20;
  int __c;
  char *pcVar21;
  uint64_t length;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  *this_03;
  ulong uVar22;
  Field *__s;
  long lVar23;
  BinaryRegionComment *pBVar24;
  string *referring_field_name;
  uint64_t uVar25;
  ulong uVar26;
  ulong uVar27;
  Optional<unsigned_long> OVar28;
  _Storage<unsigned_long,_true> local_d18;
  uint16_t union_type_id;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  uint64_t local_cf0;
  undefined1 local_cd8 [8];
  _Alloc_hider local_cd0;
  undefined1 local_cc8 [24];
  BinaryRegionCommentType local_cb0;
  _Alloc_hider local_ca8;
  pointer local_ca0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c98;
  _Alloc_hider local_c88;
  size_type local_c80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c78;
  size_t local_c68;
  uint64_t local_c60;
  string offset_prefix;
  string enum_type;
  vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
  fields;
  undefined1 local_be0 [40];
  BinaryRegionComment local_bb8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_a38;
  string local_a20 [32];
  string local_a00 [32];
  undefined1 local_9e0 [8];
  _Alloc_hider local_9d8;
  size_type local_9d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9c8;
  BinaryRegionCommentType local_9b8;
  _Alloc_hider local_9b0;
  size_type local_9a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9a0;
  _Alloc_hider local_990;
  size_type local_988;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_980;
  size_t local_970;
  string local_968 [32];
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  local_948;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  local_918;
  string local_8e8;
  string local_8c8 [32];
  string local_8a8 [32];
  string local_888 [32];
  string local_868;
  string local_848;
  BinaryRegionComment local_828;
  BinaryRegionComment local_7b0;
  BinaryRegionComment local_738;
  BinaryRegionComment local_6c0;
  BinaryRegionComment local_648;
  BinaryRegionComment local_5d0;
  BinaryRegionComment local_558;
  BinaryRegionComment local_4e0;
  BinaryRegionComment local_468;
  BinaryRegionComment local_3f0;
  BinaryRegionComment local_378;
  BinaryRegionComment local_300;
  BinaryRegionComment local_288;
  BinaryRegionComment local_210;
  BinaryRegionComment local_198;
  BinaryRegionComment local_120;
  BinaryRegionComment local_a8;
  
  bVar6 = ContainsSection(this,table_offset);
  if (bVar6) {
    return;
  }
  local_9d8._M_p = (pointer)&local_9c8;
  local_9e0._0_4_ = OK;
  local_9d0 = 0;
  local_9c8._M_local_buf[0] = '\0';
  local_9b0._M_p = (pointer)&local_9a0;
  local_9a8 = 0;
  local_9a0._M_local_buf[0] = '\0';
  local_990._M_p = (pointer)&local_980;
  local_988 = 0;
  local_980._M_local_buf[0] = '\0';
  local_970 = 0;
  local_9b8 = TableVTableOffset;
  OVar10 = ReadScalar<int>(this,table_offset);
  if (((ulong)OVar10.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> >> 0x20 & 1) == 0) {
    uVar25 = 0;
    if (table_offset <= this->binary_length_) {
      uVar25 = this->binary_length_ - table_offset;
    }
    std::__cxx11::string::string<std::allocator<char>>(local_a00,"4",(allocator<char> *)local_be0);
    local_9e0._0_4_ = ERROR_INCOMPLETE_BINARY;
    std::__cxx11::string::_M_assign((string *)&local_9d8);
    std::__cxx11::string::~string(local_a00);
    pSVar11 = reflection::Object::name(table);
    String::str_abi_cxx11_(&offset_prefix,pSVar11);
    BinaryRegionComment::BinaryRegionComment(&local_6c0,(BinaryRegionComment *)local_9e0);
    anon_unknown_45::MakeBinaryRegion
              ((BinaryRegion *)local_be0,table_offset,uVar25,Unknown,uVar25,0,&local_6c0);
    anon_unknown_45::MakeSingleRegionBinarySection
              ((BinarySection *)local_cd8,&offset_prefix,type,(BinaryRegion *)local_be0);
    AddSection(this,table_offset,(BinarySection *)local_cd8);
    BinarySection::~BinarySection((BinarySection *)local_cd8);
    BinaryRegionComment::~BinaryRegionComment(local_bb8);
    pBVar24 = &local_6c0;
  }
  else {
    uVar27 = table_offset -
             (long)OVar10.super__Optional_base<int,_true,_true>._M_payload.
                   super__Optional_payload_base<int>._M_payload;
    if (uVar27 < this->binary_length_) {
      regions.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      regions.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      regions.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      BinaryRegionComment::BinaryRegionComment(&local_7b0,(BinaryRegionComment *)local_9e0);
      anon_unknown_45::MakeBinaryRegion
                ((BinaryRegion *)local_be0,table_offset,4,SOffset,0,uVar27,&local_7b0);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
      emplace_back<flatbuffers::BinaryRegion>(&regions,(BinaryRegion *)local_be0);
      BinaryRegionComment::~BinaryRegionComment(local_bb8);
      BinaryRegionComment::~BinaryRegionComment(&local_7b0);
      pVVar12 = GetOrBuildVTable(this,uVar27,table,table_offset);
      if (pVVar12 != (VTable *)0x0) {
        uVar27 = pVVar12->table_size + table_offset;
        if (this->binary_length_ <= (pVVar12->table_size + table_offset) - 1) {
          uVar27 = this->binary_length_;
        }
        fields.
        super__Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        fields.
        super__Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        fields.
        super__Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        __x = &pVVar12->fields;
        p_Var13 = &(pVVar12->fields)._M_t._M_impl.super__Rb_tree_header;
        for (p_Var14 = (pVVar12->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            pEVar5 = fields.
                     super__Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
            pEVar4 = fields.
                     super__Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            (_Rb_tree_header *)p_Var14 != p_Var13;
            p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
          std::
          vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
          ::push_back(&fields,(value_type *)&p_Var14[1]._M_parent);
        }
        if (fields.
            super__Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            fields.
            super__Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<flatbuffers::BinaryAnnotator::VTable::Entry_*,_std::vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>_>,_flatbuffers::BinaryAnnotator::VTable::Entry>
          ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<flatbuffers::BinaryAnnotator::VTable::Entry_*,_std::vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>_>,_flatbuffers::BinaryAnnotator::VTable::Entry>
                               *)local_be0,
                              (__normal_iterator<flatbuffers::BinaryAnnotator::VTable::Entry_*,_std::vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                               )fields.
                                super__Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                              (((long)fields.
                                      super__Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)fields.
                                      super__Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4) + 1) / 2);
          if ((pointer)local_be0._16_8_ == (pointer)0x0) {
            std::
            __inplace_stable_sort<__gnu_cxx::__normal_iterator<flatbuffers::BinaryAnnotator::VTable::Entry*,std::vector<flatbuffers::BinaryAnnotator::VTable::Entry,std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<flatbuffers::BinaryAnnotator::BuildTable(unsigned_long,flatbuffers::BinarySectionType,reflection::Object_const*)::__0>>
                      (pEVar4);
          }
          else {
            std::
            __stable_sort_adaptive<__gnu_cxx::__normal_iterator<flatbuffers::BinaryAnnotator::VTable::Entry*,std::vector<flatbuffers::BinaryAnnotator::VTable::Entry,std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>>>,flatbuffers::BinaryAnnotator::VTable::Entry*,long,__gnu_cxx::__ops::_Iter_comp_iter<flatbuffers::BinaryAnnotator::BuildTable(unsigned_long,flatbuffers::BinarySectionType,reflection::Object_const*)::__0>>
                      (pEVar4,pEVar5,local_be0._16_8_,local_be0._8_8_);
          }
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<flatbuffers::BinaryAnnotator::VTable::Entry_*,_std::vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>_>,_flatbuffers::BinaryAnnotator::VTable::Entry>
          ::~_Temporary_buffer
                    ((_Temporary_buffer<__gnu_cxx::__normal_iterator<flatbuffers::BinaryAnnotator::VTable::Entry_*,_std::vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>_>,_flatbuffers::BinaryAnnotator::VTable::Entry>
                      *)local_be0);
        }
        lVar23 = 0;
        local_c60 = table_offset;
        for (uVar19 = 1;
            uVar20 = (long)fields.
                           super__Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)fields.
                           super__Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4, uVar19 - 1 < uVar20;
            uVar19 = uVar19 + 1) {
          uVar22 = (ulong)*(ushort *)
                           ((long)&(fields.
                                    super__Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->offset_from_table +
                           lVar23);
          if ((uVar22 == 0) || (uVar22 = uVar22 + local_c60, this->binary_length_ <= uVar22))
          goto LAB_0022d071;
          this_00 = *(Field **)
                     ((long)&(fields.
                              super__Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field + lVar23);
          if (this_00 == (Field *)0x0) {
            uVar26 = uVar27;
            if (uVar19 < uVar20) {
              uVar26 = *(ushort *)
                        ((long)&fields.
                                super__Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].offset_from_table +
                        lVar23) + local_c60;
            }
            uVar20 = uVar26 - uVar22;
            if (uVar20 != 0) {
              offset_prefix._M_dataplus._M_p = (pointer)&offset_prefix.field_2;
              offset_prefix._M_string_length = 0;
              offset_prefix.field_2._M_local_buf[0] = '\0';
              if ((uVar20 == 4) &&
                 (OVar17 = ReadScalar<unsigned_int>(this,uVar22),
                 ((ulong)OVar17.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_int> & 0x100000000) != 0)) {
                std::__cxx11::string::append((char *)&offset_prefix);
                std::__cxx11::stringstream::stringstream((stringstream *)local_be0);
                *(uint *)((long)&local_bb8[0].status + *(long *)(local_be0._16_8_ - 0x18)) =
                     *(uint *)((long)&local_bb8[0].status + *(long *)(local_be0._16_8_ - 0x18)) &
                     0xffffffb5 | 8;
                puVar1 = (uint *)((long)&local_bb8[0].status + *(long *)(local_be0._16_8_ - 0x18));
                *puVar1 = *puVar1 | 0x4000;
                poVar16 = std::operator<<(local_be0 + 0x10,0x30);
                *(undefined8 *)(poVar16 + *(long *)(*(long *)poVar16 + -0x18) + 0x10) = 8;
                std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                std::__cxx11::stringbuf::str();
                std::__cxx11::stringstream::~stringstream((stringstream *)local_be0);
                std::__cxx11::string::append((string *)&offset_prefix);
                std::__cxx11::string::~string((string *)local_cd8);
                std::__cxx11::string::append((char *)&offset_prefix);
              }
              local_cd8._0_4_ = OK;
              local_cd0._M_p = local_cc8 + 8;
              local_cc8._0_8_ = 0;
              local_cc8[8] = '\0';
              local_ca8._M_p = (pointer)&local_c98;
              local_ca0 = (pointer)0x0;
              local_c98._M_local_buf[0] = '\0';
              local_c88._M_p = (pointer)&local_c78;
              local_c80 = 0;
              local_c78._M_local_buf[0] = '\0';
              local_c68 = 0;
              local_cb0 = TableUnknownField;
              uVar2 = this->binary_length_;
              if (uVar20 < uVar2 && uVar26 - 1 < uVar2) {
                std::__cxx11::string::_M_assign((string *)&local_c88);
                BinaryRegionComment::BinaryRegionComment
                          (&local_120,(BinaryRegionComment *)local_cd8);
                anon_unknown_45::MakeBinaryRegion
                          ((BinaryRegion *)local_be0,uVar22,uVar20,Unknown,uVar20,0,&local_120);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&regions,(BinaryRegion *)local_be0);
                BinaryRegionComment::~BinaryRegionComment(local_bb8);
                BinaryRegionComment::~BinaryRegionComment(&local_120);
              }
              else {
                uVar25 = 0;
                if (uVar22 <= uVar2) {
                  uVar25 = uVar2 - uVar22;
                }
                std::__cxx11::to_string(&local_848,uVar20);
                local_cd8._0_4_ = ERROR_INCOMPLETE_BINARY;
                std::__cxx11::string::_M_assign((string *)&local_cd0);
                std::__cxx11::string::~string((string *)&local_848);
                BinaryRegionComment::BinaryRegionComment(&local_a8,(BinaryRegionComment *)local_cd8)
                ;
                anon_unknown_45::MakeBinaryRegion
                          ((BinaryRegion *)local_be0,uVar22,uVar25,Unknown,uVar25,0,&local_a8);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&regions,(BinaryRegion *)local_be0);
                BinaryRegionComment::~BinaryRegionComment(local_bb8);
                BinaryRegionComment::~BinaryRegionComment(&local_a8);
              }
              BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_cd8);
              std::__cxx11::string::~string((string *)&offset_prefix);
            }
            goto LAB_0022d071;
          }
          pTVar15 = reflection::Field::type(this_00);
          BVar8 = reflection::Type::base_type(pTVar15);
          if (BVar8 - UType < 0xc) {
            pTVar15 = reflection::Field::type(this_00);
            BVar8 = reflection::Type::base_type(pTVar15);
            uVar20 = *(ulong *)(GetTypeSize(reflection::BaseType)::sizes + (ulong)BVar8 * 8);
            pTVar15 = reflection::Field::type(this_00);
            BVar8 = reflection::Type::base_type(pTVar15);
            BVar9 = GetRegionType(BVar8);
            local_cd8._0_4_ = OK;
            local_cd0._M_p = local_cc8 + 8;
            local_cc8._0_8_ = 0;
            local_cc8[8] = '\0';
            local_ca8._M_p = (pointer)&local_c98;
            local_ca0 = (pointer)0x0;
            local_c98._M_local_buf[0] = '\0';
            local_c88._M_p = (pointer)&local_c78;
            local_c80 = 0;
            local_c78._M_local_buf[0] = '\0';
            local_c68 = 0;
            local_cb0 = TableField;
            pSVar11 = reflection::Field::name(this_00);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_a58,(char *)(pSVar11 + 1),(allocator<char> *)&union_type_id)
            ;
            std::operator+(&enum_type,&local_a58,"` (");
            pTVar15 = reflection::Field::type(this_00);
            BVar8 = reflection::Type::base_type(pTVar15);
            pcVar21 = "";
            if (BVar8 < (Union|UByte)) {
              pcVar21 = *(char **)(reflection::EnumNamesBaseType()::names + (ulong)BVar8 * 8);
            }
            std::operator+(&offset_prefix,&enum_type,pcVar21);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_be0,&offset_prefix,")");
            std::__cxx11::string::operator=((string *)&local_ca8,(string *)local_be0);
            std::__cxx11::string::~string((string *)local_be0);
            std::__cxx11::string::~string((string *)&offset_prefix);
            std::__cxx11::string::~string((string *)&enum_type);
            std::__cxx11::string::~string((string *)&local_a58);
            uVar26 = this->binary_length_;
            if ((uVar20 < uVar26) && ((uVar20 + uVar22) - 1 < uVar26)) {
              bVar6 = IsUnionType(this,this_00);
              if (bVar6) {
                if ((this->binary_length_ < 2) || (this->binary_length_ <= uVar22)) {
                  std::__throw_bad_optional_access();
                }
                bVar6 = IsValidUnionValue(this,this_00,this->binary_[uVar22]);
                if (bVar6) goto LAB_0022c4b7;
                std::__cxx11::string::string<std::allocator<char>>
                          (local_888,"",(allocator<char> *)local_be0);
                local_cd8._0_4_ = ERROR_INVALID_UNION_TYPE;
                std::__cxx11::string::_M_assign((string *)&local_cd0);
                std::__cxx11::string::~string(local_888);
                pBVar24 = &local_210;
                BinaryRegionComment::BinaryRegionComment(pBVar24,(BinaryRegionComment *)local_cd8);
                anon_unknown_45::MakeBinaryRegion
                          ((BinaryRegion *)local_be0,uVar22,uVar20,BVar9,0,0,pBVar24);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&regions,(BinaryRegion *)local_be0);
              }
              else {
LAB_0022c4b7:
                pBVar24 = &local_288;
                BinaryRegionComment::BinaryRegionComment(pBVar24,(BinaryRegionComment *)local_cd8);
                anon_unknown_45::MakeBinaryRegion
                          ((BinaryRegion *)local_be0,uVar22,uVar20,BVar9,0,0,pBVar24);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&regions,(BinaryRegion *)local_be0);
              }
              BinaryRegionComment::~BinaryRegionComment(local_bb8);
              BinaryRegionComment::~BinaryRegionComment(pBVar24);
            }
            else {
              uVar25 = 0;
              if (uVar22 <= uVar26) {
                uVar25 = uVar26 - uVar22;
              }
              std::__cxx11::to_string(&local_868,uVar20);
              local_cd8._0_4_ = ERROR_INCOMPLETE_BINARY;
              std::__cxx11::string::_M_assign((string *)&local_cd0);
              std::__cxx11::string::~string((string *)&local_868);
              BinaryRegionComment::BinaryRegionComment(&local_198,(BinaryRegionComment *)local_cd8);
              anon_unknown_45::MakeBinaryRegion
                        ((BinaryRegion *)local_be0,uVar22,uVar25,Unknown,uVar25,0,&local_198);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              emplace_back<flatbuffers::BinaryRegion>(&regions,(BinaryRegion *)local_be0);
              BinaryRegionComment::~BinaryRegionComment(local_bb8);
              BinaryRegionComment::~BinaryRegionComment(&local_198);
            }
            goto LAB_0022d06c;
          }
          bVar6 = reflection::Field::offset64(this_00);
          if (bVar6) {
            OVar28 = ReadScalar<unsigned_long>(this,uVar22);
            local_d18._M_value =
                 OVar28.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>._M_payload;
            if (((undefined1  [16])
                 OVar28.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
                (undefined1  [16])0x0) {
              local_d18._M_value = 0;
            }
            BVar9 = UOffset64;
            local_cf0 = 8;
          }
          else {
            OVar17 = ReadScalar<unsigned_int>(this,uVar22);
            local_d18._M_value =
                 (ulong)OVar17.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int> & 0xffffffff;
            if (((ulong)OVar17.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) {
              local_d18._M_value = 0;
            }
            BVar9 = UOffset;
            local_cf0 = 4;
          }
          local_cd8._0_4_ = OK;
          local_cd0._M_p = local_cc8 + 8;
          local_cc8._0_8_ = 0;
          local_cc8[8] = '\0';
          local_ca8._M_p = (pointer)&local_c98;
          local_ca0 = (pointer)0x0;
          local_c98._M_local_buf[0] = '\0';
          local_c88._M_p = (pointer)&local_c78;
          local_c80 = 0;
          local_c78._M_local_buf[0] = '\0';
          local_c68 = 0;
          local_cb0 = TableOffsetField;
          reflection::Field::name(this_00);
          std::__cxx11::string::assign((char *)&local_ca8);
          pSVar11 = reflection::Field::name(this_00);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&enum_type,(char *)(pSVar11 + 1),(allocator<char> *)&local_a58);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_be0,"offset to field `",&enum_type);
          std::operator+(&offset_prefix,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_be0,"`");
          std::__cxx11::string::~string((string *)local_be0);
          std::__cxx11::string::~string((string *)&enum_type);
          __s = this_00;
          bVar6 = IsInlineField(this,this_00);
          if (!bVar6) {
            if (local_d18._M_value == 0) {
              uVar25 = 0;
              if (uVar22 <= this->binary_length_) {
                uVar25 = this->binary_length_ - uVar22;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        (local_8a8,"4",(allocator<char> *)local_be0);
              local_cd8._0_4_ = ERROR_INCOMPLETE_BINARY;
              std::__cxx11::string::_M_assign((string *)&local_cd0);
              std::__cxx11::string::~string(local_8a8);
              pBVar24 = &local_300;
              BinaryRegionComment::BinaryRegionComment(pBVar24,(BinaryRegionComment *)local_cd8);
              anon_unknown_45::MakeBinaryRegion
                        ((BinaryRegion *)local_be0,uVar22,uVar25,Unknown,uVar25,0,pBVar24);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              emplace_back<flatbuffers::BinaryRegion>(&regions,(BinaryRegion *)local_be0);
LAB_0022cba5:
              BinaryRegionComment::~BinaryRegionComment(local_bb8);
            }
            else {
              local_d18._M_value = local_d18._M_value + uVar22;
              if (local_d18._M_value < this->binary_length_) goto LAB_0022c8fd;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_8c8,"",(allocator<char> *)local_be0);
              local_cd8._0_4_ = ERROR_OFFSET_OUT_OF_BINARY;
              std::__cxx11::string::_M_assign((string *)&local_cd0);
              std::__cxx11::string::~string(local_8c8);
              pBVar24 = &local_378;
              BinaryRegionComment::BinaryRegionComment(pBVar24,(BinaryRegionComment *)local_cd8);
              anon_unknown_45::MakeBinaryRegion
                        ((BinaryRegion *)local_be0,uVar22,local_cf0,BVar9,0,local_d18._M_value,
                         pBVar24);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              emplace_back<flatbuffers::BinaryRegion>(&regions,(BinaryRegion *)local_be0);
              BinaryRegionComment::~BinaryRegionComment(local_bb8);
            }
            BinaryRegionComment::~BinaryRegionComment(pBVar24);
            goto switchD_0022c927_caseD_11;
          }
          local_d18 = (_Storage<unsigned_long,_true>)0x0;
LAB_0022c8fd:
          pTVar15 = reflection::Field::type(this_00);
          BVar8 = reflection::Type::base_type(pTVar15);
          switch(BVar8) {
          case String:
            std::__cxx11::string::assign((char *)&local_c88);
            BinaryRegionComment::BinaryRegionComment(&local_468,(BinaryRegionComment *)local_cd8);
            anon_unknown_45::MakeBinaryRegion
                      ((BinaryRegion *)local_be0,uVar22,local_cf0,BVar9,0,(uint64_t)local_d18,
                       &local_468);
            std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
            emplace_back<flatbuffers::BinaryRegion>(&regions,(BinaryRegion *)local_be0);
            BinaryRegionComment::~BinaryRegionComment(local_bb8);
            BinaryRegionComment::~BinaryRegionComment(&local_468);
            BuildString(this,(uint64_t)local_d18,table,this_00);
            break;
          case Vector:
            std::__cxx11::string::assign((char *)&local_c88);
            BinaryRegionComment::BinaryRegionComment(&local_4e0,(BinaryRegionComment *)local_cd8);
            anon_unknown_45::MakeBinaryRegion
                      ((BinaryRegion *)local_be0,uVar22,local_cf0,BVar9,0,(uint64_t)local_d18,
                       &local_4e0);
            std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
            emplace_back<flatbuffers::BinaryRegion>(&regions,(BinaryRegion *)local_be0);
            BinaryRegionComment::~BinaryRegionComment(local_bb8);
            BinaryRegionComment::~BinaryRegionComment(&local_4e0);
            std::
            _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
            ::_Rb_tree(&local_918,&__x->_M_t);
            this_03 = &local_918;
            BuildVector(this,(uint64_t)local_d18,table,this_00,local_c60,
                        (map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                         *)this_03);
            goto LAB_0022d052;
          case Obj:
            this_01 = reflection::Schema::objects(this->schema_);
            pTVar15 = reflection::Field::type(this_00);
            pcVar21 = reflection::Type::index(pTVar15,(char *)__s,__c);
            this_02 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                                (this_01,(uint)pcVar21);
            bVar6 = reflection::Object::is_struct(this_02);
            if (bVar6) {
              pSVar11 = reflection::Field::name(this_00);
              referring_field_name = &local_8e8;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)referring_field_name,(char *)(pSVar11 + 1),
                         (allocator<char> *)local_be0);
              BuildStruct(this,uVar22,&regions,referring_field_name,this_02);
LAB_0022cf96:
              std::__cxx11::string::~string((string *)referring_field_name);
            }
            else {
              std::__cxx11::string::assign((char *)&local_c88);
              BinaryRegionComment::BinaryRegionComment(&local_3f0,(BinaryRegionComment *)local_cd8);
              anon_unknown_45::MakeBinaryRegion
                        ((BinaryRegion *)local_be0,uVar22,local_cf0,BVar9,0,(uint64_t)local_d18,
                         &local_3f0);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              emplace_back<flatbuffers::BinaryRegion>(&regions,(BinaryRegion *)local_be0);
              BinaryRegionComment::~BinaryRegionComment(local_bb8);
              BinaryRegionComment::~BinaryRegionComment(&local_3f0);
              BuildTable(this,(uint64_t)local_d18,Table,this_02);
            }
            break;
          case Union:
            uVar7 = reflection::Field::id(this_00);
            union_type_id = uVar7 - 1;
            cVar18 = std::
                     _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                     ::find(&__x->_M_t,&union_type_id);
            if ((_Rb_tree_header *)cVar18._M_node != p_Var13) {
              std::__cxx11::string::assign((char *)&local_c88);
              uVar26 = *(ushort *)&cVar18._M_node[1]._M_left + local_c60;
              uVar20 = this->binary_length_;
              if ((uVar20 < 2) || (uVar20 <= uVar26)) {
                uVar25 = 0;
                if (uVar26 <= uVar20) {
                  uVar25 = uVar20 - uVar26;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          (local_968,"1",(allocator<char> *)local_be0);
                local_cd8._0_4_ = ERROR_INCOMPLETE_BINARY;
                std::__cxx11::string::_M_assign((string *)&local_cd0);
                std::__cxx11::string::~string(local_968);
                pBVar24 = &local_5d0;
                BinaryRegionComment::BinaryRegionComment(pBVar24,(BinaryRegionComment *)local_cd8);
                anon_unknown_45::MakeBinaryRegion
                          ((BinaryRegion *)local_be0,uVar26,uVar25,Unknown,uVar25,0,pBVar24);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&regions,(BinaryRegion *)local_be0);
                goto LAB_0022cba5;
              }
              value = this->binary_[uVar26];
              bVar6 = IsValidUnionValue(this,this_00,value);
              if (bVar6) {
                BuildUnion_abi_cxx11_(&enum_type,this,(uint64_t)local_d18,value,this_00);
                std::operator+(&local_a58,"(union of type `",&enum_type);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_be0,&local_a58,"`)");
                std::__cxx11::string::operator=((string *)&local_c88,(string *)local_be0);
                std::__cxx11::string::~string((string *)local_be0);
                std::__cxx11::string::~string((string *)&local_a58);
                BinaryRegionComment::BinaryRegionComment
                          (&local_648,(BinaryRegionComment *)local_cd8);
                anon_unknown_45::MakeBinaryRegion
                          ((BinaryRegion *)local_be0,uVar22,local_cf0,BVar9,0,(uint64_t)local_d18,
                           &local_648);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&regions,(BinaryRegion *)local_be0);
                BinaryRegionComment::~BinaryRegionComment(local_bb8);
                BinaryRegionComment::~BinaryRegionComment(&local_648);
                referring_field_name = &enum_type;
                goto LAB_0022cf96;
              }
            }
            break;
          case Vector64:
            std::__cxx11::string::assign((char *)&local_c88);
            BinaryRegionComment::BinaryRegionComment(&local_558,(BinaryRegionComment *)local_cd8);
            anon_unknown_45::MakeBinaryRegion
                      ((BinaryRegion *)local_be0,uVar22,local_cf0,BVar9,0,(uint64_t)local_d18,
                       &local_558);
            std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
            emplace_back<flatbuffers::BinaryRegion>(&regions,(BinaryRegion *)local_be0);
            BinaryRegionComment::~BinaryRegionComment(local_bb8);
            BinaryRegionComment::~BinaryRegionComment(&local_558);
            std::
            _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
            ::_Rb_tree(&local_948,&__x->_M_t);
            this_03 = &local_948;
            BuildVector(this,(uint64_t)local_d18,table,this_00,local_c60,
                        (map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                         *)this_03);
LAB_0022d052:
            std::
            _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
            ::~_Rb_tree(this_03);
          }
switchD_0022c927_caseD_11:
          std::__cxx11::string::~string((string *)&offset_prefix);
LAB_0022d06c:
          BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_cd8);
LAB_0022d071:
          lVar23 = lVar23 + 0x10;
        }
        uVar25 = regions.
                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].offset;
        uVar3 = regions.
                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].length;
        uVar19 = uVar3 + uVar25 + 1;
        lVar23 = uVar27 - uVar19;
        if (uVar19 <= uVar27 && lVar23 != 0) {
          local_cd8._0_4_ = OK;
          local_cd0._M_p = local_cc8 + 8;
          local_cc8._0_8_ = 0;
          local_cc8[8] = '\0';
          local_ca8._M_p = (pointer)&local_c98;
          local_ca0 = (pointer)0x0;
          local_c98._M_local_buf[0] = '\0';
          local_c88._M_p = (pointer)&local_c78;
          local_c80 = 0;
          local_c78._M_local_buf[0] = '\0';
          local_c68 = 0;
          local_cb0 = Padding;
          BinaryRegionComment::BinaryRegionComment(&local_828,(BinaryRegionComment *)local_cd8);
          length = lVar23 + 1;
          anon_unknown_45::MakeBinaryRegion
                    ((BinaryRegion *)local_be0,uVar3 + uVar25,length,Uint8,length,0,&local_828);
          std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
          emplace_back<flatbuffers::BinaryRegion>(&regions,(BinaryRegion *)local_be0);
          BinaryRegionComment::~BinaryRegionComment(local_bb8);
          BinaryRegionComment::~BinaryRegionComment(&local_828);
          BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_cd8);
        }
        pSVar11 = reflection::Object::name(table);
        String::str_abi_cxx11_((string *)local_cd8,pSVar11);
        local_a38.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_start =
             regions.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_a38.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             regions.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_a38.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             regions.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        regions.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        regions.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        regions.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        anon_unknown_45::MakeBinarySection
                  ((BinarySection *)local_be0,(string *)local_cd8,type,&local_a38);
        AddSection(this,local_c60,(BinarySection *)local_be0);
        BinarySection::~BinarySection((BinarySection *)local_be0);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                  (&local_a38);
        std::__cxx11::string::~string((string *)local_cd8);
        std::
        _Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
        ::~_Vector_base(&fields.
                         super__Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                       );
      }
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                (&regions);
      goto LAB_0022d33a;
    }
    std::__cxx11::string::string<std::allocator<char>>(local_a20,"",(allocator<char> *)local_be0);
    local_9e0._0_4_ = ERROR_OFFSET_OUT_OF_BINARY;
    std::__cxx11::string::_M_assign((string *)&local_9d8);
    std::__cxx11::string::~string(local_a20);
    pSVar11 = reflection::Object::name(table);
    String::str_abi_cxx11_(&offset_prefix,pSVar11);
    BinaryRegionComment::BinaryRegionComment(&local_738,(BinaryRegionComment *)local_9e0);
    anon_unknown_45::MakeBinaryRegion
              ((BinaryRegion *)local_be0,table_offset,4,SOffset,0,uVar27,&local_738);
    anon_unknown_45::MakeSingleRegionBinarySection
              ((BinarySection *)local_cd8,&offset_prefix,type,(BinaryRegion *)local_be0);
    AddSection(this,table_offset,(BinarySection *)local_cd8);
    BinarySection::~BinarySection((BinarySection *)local_cd8);
    BinaryRegionComment::~BinaryRegionComment(local_bb8);
    pBVar24 = &local_738;
  }
  BinaryRegionComment::~BinaryRegionComment(pBVar24);
  std::__cxx11::string::~string((string *)&offset_prefix);
LAB_0022d33a:
  BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_9e0);
  return;
}

Assistant:

void BinaryAnnotator::BuildTable(const uint64_t table_offset,
                                 const BinarySectionType type,
                                 const reflection::Object *const table) {
  if (ContainsSection(table_offset)) { return; }

  BinaryRegionComment vtable_offset_comment;
  vtable_offset_comment.type = BinaryRegionCommentType::TableVTableOffset;

  const auto vtable_soffset = ReadScalar<int32_t>(table_offset);

  if (!vtable_soffset.has_value()) {
    const uint64_t remaining = RemainingBytes(table_offset);
    SetError(vtable_offset_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
             "4");

    AddSection(
        table_offset,
        MakeSingleRegionBinarySection(
            table->name()->str(), type,
            MakeBinaryRegion(table_offset, remaining, BinaryRegionType::Unknown,
                             remaining, 0, vtable_offset_comment)));

    // If there aren't enough bytes left to read the vtable offset, there is
    // nothing we can do.
    return;
  }

  // Tables start with the vtable
  const uint64_t vtable_offset = table_offset - vtable_soffset.value();

  if (!IsValidOffset(vtable_offset)) {
    SetError(vtable_offset_comment,
             BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);

    AddSection(table_offset,
               MakeSingleRegionBinarySection(
                   table->name()->str(), type,
                   MakeBinaryRegion(table_offset, sizeof(int32_t),
                                    BinaryRegionType::SOffset, 0, vtable_offset,
                                    vtable_offset_comment)));

    // There isn't much to do with an invalid vtable offset, as we won't be able
    // to intepret the rest of the table fields.
    return;
  }

  std::vector<BinaryRegion> regions;
  regions.push_back(MakeBinaryRegion(table_offset, sizeof(int32_t),
                                     BinaryRegionType::SOffset, 0,
                                     vtable_offset, vtable_offset_comment));

  // Parse the vtable first so we know what the rest of the fields in the table
  // are.
  const VTable *const vtable =
      GetOrBuildVTable(vtable_offset, table, table_offset);

  if (vtable == nullptr) {
    // There is no valid vtable for this table, so we cannot process the rest of
    // the table entries.
    return;
  }

  // This is the size and length of this table.
  const uint16_t table_size = vtable->table_size;
  uint64_t table_end_offset = table_offset + table_size;

  if (!IsValidOffset(table_end_offset - 1)) {
    // We already validated the table size in BuildVTable, but we have to make
    // sure we don't use a bad value here.
    table_end_offset = binary_length_;
  }

  // We need to iterate over the vtable fields by their offset in the binary,
  // not by their IDs. So copy them over to another vector that we can sort on
  // the offset_from_table property.
  std::vector<VTable::Entry> fields;
  for (const auto &vtable_field : vtable->fields) {
    fields.push_back(vtable_field.second);
  }

  std::stable_sort(fields.begin(), fields.end(),
                   [](const VTable::Entry &a, const VTable::Entry &b) {
                     return a.offset_from_table < b.offset_from_table;
                   });

  // Iterate over all the fields by order of their offset.
  for (size_t i = 0; i < fields.size(); ++i) {
    const reflection::Field *field = fields[i].field;
    const uint16_t offset_from_table = fields[i].offset_from_table;

    if (offset_from_table == 0) {
      // Skip non-present fields.
      continue;
    }

    // The field offsets are relative to the start of the table.
    const uint64_t field_offset = table_offset + offset_from_table;

    if (!IsValidOffset(field_offset)) {
      // The field offset is larger than the binary, nothing we can do.
      continue;
    }

    // We have a vtable entry for a non-existant field, that means its a binary
    // generated by a newer schema than we are currently processing.
    if (field == nullptr) {
      // Calculate the length of this unknown field.
      const uint64_t unknown_field_length =
          // Check if there is another unknown field after this one.
          ((i + 1 < fields.size())
               ? table_offset + fields[i + 1].offset_from_table
               // Otherwise use the known end of the table.
               : table_end_offset) -
          field_offset;

      if (unknown_field_length == 0) { continue; }

      std::string hint;

      if (unknown_field_length == 4) {
        const auto relative_offset = ReadScalar<uint32_t>(field_offset);
        if (relative_offset.has_value()) {
          // The field is 4 in length, so it could be an offset? Provide a hint.
          hint += "<possibly an offset? Check Loc: +0x";
          hint += ToHex(field_offset + relative_offset.value());
          hint += ">";
        }
      }

      BinaryRegionComment unknown_field_comment;
      unknown_field_comment.type = BinaryRegionCommentType::TableUnknownField;

      if (!IsValidRead(field_offset, unknown_field_length)) {
        const uint64_t remaining = RemainingBytes(field_offset);

        SetError(unknown_field_comment,
                 BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
                 std::to_string(unknown_field_length));

        regions.push_back(MakeBinaryRegion(field_offset, remaining,
                                           BinaryRegionType::Unknown, remaining,
                                           0, unknown_field_comment));
        continue;
      }

      unknown_field_comment.default_value = hint;

      regions.push_back(MakeBinaryRegion(
          field_offset, unknown_field_length, BinaryRegionType::Unknown,
          unknown_field_length, 0, unknown_field_comment));
      continue;
    }

    if (IsScalar(field->type()->base_type())) {
      // These are the raw values store in the table.
      const uint64_t type_size = GetTypeSize(field->type()->base_type());
      const BinaryRegionType region_type =
          GetRegionType(field->type()->base_type());

      BinaryRegionComment scalar_field_comment;
      scalar_field_comment.type = BinaryRegionCommentType::TableField;
      scalar_field_comment.name =
          std::string(field->name()->c_str()) + "` (" +
          reflection::EnumNameBaseType(field->type()->base_type()) + ")";

      if (!IsValidRead(field_offset, type_size)) {
        const uint64_t remaining = RemainingBytes(field_offset);
        SetError(scalar_field_comment,
                 BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
                 std::to_string(type_size));

        regions.push_back(MakeBinaryRegion(field_offset, remaining,
                                           BinaryRegionType::Unknown, remaining,
                                           0, scalar_field_comment));
        continue;
      }

      if (IsUnionType(field)) {
        // This is a type for a union. Validate the value
        const auto enum_value = ReadScalar<uint8_t>(field_offset);

        // This should always have a value, due to the IsValidRead check above.
        if (!IsValidUnionValue(field, enum_value.value())) {
          SetError(scalar_field_comment,
                   BinaryRegionStatus::ERROR_INVALID_UNION_TYPE);

          regions.push_back(MakeBinaryRegion(field_offset, type_size,
                                             region_type, 0, 0,
                                             scalar_field_comment));
          continue;
        }
      }

      regions.push_back(MakeBinaryRegion(field_offset, type_size, region_type,
                                         0, 0, scalar_field_comment));
      continue;
    }

    // Read the offset
    uint64_t offset = 0;
    uint64_t length = sizeof(uint32_t);
    BinaryRegionType region_type = BinaryRegionType::UOffset;

    if (field->offset64()) {
      length = sizeof(uint64_t);
      region_type = BinaryRegionType::UOffset64;
      offset = ReadScalar<uint64_t>(field_offset).value_or(0);
    } else {
      offset = ReadScalar<uint32_t>(field_offset).value_or(0);
    }
    // const auto offset_from_field = ReadScalar<uint32_t>(field_offset);
    uint64_t offset_of_next_item = 0;
    BinaryRegionComment offset_field_comment;
    offset_field_comment.type = BinaryRegionCommentType::TableOffsetField;
    offset_field_comment.name = field->name()->c_str();
    const std::string offset_prefix =
        "offset to field `" + std::string(field->name()->c_str()) + "`";

    // Validate any field that isn't inline (i.e., non-structs).
    if (!IsInlineField(field)) {
      if (offset == 0) {
        const uint64_t remaining = RemainingBytes(field_offset);

        SetError(offset_field_comment,
                 BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "4");

        regions.push_back(MakeBinaryRegion(field_offset, remaining,
                                           BinaryRegionType::Unknown, remaining,
                                           0, offset_field_comment));
        continue;
      }

      offset_of_next_item = field_offset + offset;

      if (!IsValidOffset(offset_of_next_item)) {
        SetError(offset_field_comment,
                 BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);
        regions.push_back(MakeBinaryRegion(field_offset, length, region_type, 0,
                                           offset_of_next_item,
                                           offset_field_comment));
        continue;
      }
    }

    switch (field->type()->base_type()) {
      case reflection::BaseType::Obj: {
        const reflection::Object *next_object =
            schema_->objects()->Get(field->type()->index());

        if (next_object->is_struct()) {
          // Structs are stored inline.
          BuildStruct(field_offset, regions, field->name()->c_str(),
                      next_object);
        } else {
          offset_field_comment.default_value = "(table)";

          regions.push_back(MakeBinaryRegion(field_offset, length, region_type,
                                             0, offset_of_next_item,
                                             offset_field_comment));

          BuildTable(offset_of_next_item, BinarySectionType::Table,
                     next_object);
        }
      } break;

      case reflection::BaseType::String: {
        offset_field_comment.default_value = "(string)";
        regions.push_back(MakeBinaryRegion(field_offset, length, region_type, 0,
                                           offset_of_next_item,
                                           offset_field_comment));
        BuildString(offset_of_next_item, table, field);
      } break;

      case reflection::BaseType::Vector: {
        offset_field_comment.default_value = "(vector)";
        regions.push_back(MakeBinaryRegion(field_offset, length, region_type, 0,
                                           offset_of_next_item,
                                           offset_field_comment));
        BuildVector(offset_of_next_item, table, field, table_offset,
                    vtable->fields);
      } break;
      case reflection::BaseType::Vector64: {
        offset_field_comment.default_value = "(vector64)";
        regions.push_back(MakeBinaryRegion(field_offset, length, region_type, 0,
                                           offset_of_next_item,
                                           offset_field_comment));
        BuildVector(offset_of_next_item, table, field, table_offset,
                    vtable->fields);
      } break;

      case reflection::BaseType::Union: {
        const uint64_t union_offset = offset_of_next_item;

        // The union type field is always one less than the union itself.
        const uint16_t union_type_id = field->id() - 1;

        auto vtable_field = vtable->fields.find(union_type_id);
        if (vtable_field == vtable->fields.end()) {
          // TODO(dbaileychess): need to capture this error condition.
          break;
        }
        offset_field_comment.default_value = "(union)";

        const uint64_t type_offset =
            table_offset + vtable_field->second.offset_from_table;

        const auto realized_type = ReadScalar<uint8_t>(type_offset);
        if (!realized_type.has_value()) {
          const uint64_t remaining = RemainingBytes(type_offset);
          SetError(offset_field_comment,
                   BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "1");
          regions.push_back(MakeBinaryRegion(
              type_offset, remaining, BinaryRegionType::Unknown, remaining, 0,
              offset_field_comment));
          continue;
        }

        if (!IsValidUnionValue(field, realized_type.value())) {
          // We already export an error in the union type field, so just skip
          // building the union itself and it will default to an unreference
          // Binary section.
          continue;
        }

        const std::string enum_type =
            BuildUnion(union_offset, realized_type.value(), field);

        offset_field_comment.default_value =
            "(union of type `" + enum_type + "`)";

        regions.push_back(MakeBinaryRegion(field_offset, length, region_type, 0,
                                           union_offset, offset_field_comment));

      } break;

      default: break;
    }
  }

  // Handle the case where there is padding after the last known binary
  // region. Calculate where we left off towards the expected end of the
  // table.
  const uint64_t i = regions.back().offset + regions.back().length + 1;

  if (i < table_end_offset) {
    const uint64_t pad_bytes = table_end_offset - i + 1;

    BinaryRegionComment padding_comment;
    padding_comment.type = BinaryRegionCommentType::Padding;

    regions.push_back(MakeBinaryRegion(i - 1, pad_bytes * sizeof(uint8_t),
                                       BinaryRegionType::Uint8, pad_bytes, 0,
                                       padding_comment));
  }

  AddSection(table_offset,
             MakeBinarySection(table->name()->str(), type, std::move(regions)));
}